

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void testing::internal::ShuffleRange<int>
               (Random *random,int begin,int end,vector<int,_std::allocator<int>_> *v)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  UInt32 UVar4;
  size_type sVar5;
  ostream *poVar6;
  reference __a;
  reference __b;
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  int selected;
  int last_in_range;
  int range_width;
  int size;
  GTestLog *in_stack_ffffffffffffff40;
  bool local_71;
  ostream *in_stack_ffffffffffffffa8;
  GTestLog *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  GTestLogSeverity severity;
  uint in_stack_ffffffffffffffc0;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffc4;
  int local_34;
  GTestLog local_30 [4];
  GTestLog local_20;
  int local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  int local_10;
  int local_c;
  
  severity = (GTestLogSeverity)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  local_1c = (int)sVar5;
  uVar7 = in_stack_ffffffffffffffc0 & 0xffffff;
  if (-1 < local_c) {
    uVar7 = CONCAT13(local_c <= local_1c,(int3)in_stack_ffffffffffffffc0);
  }
  bVar2 = IsTrue(SUB41(uVar7 >> 0x18,0));
  if (!bVar2) {
    in_stack_ffffffffffffffb0 = &local_20;
    GTestLog::GTestLog((GTestLog *)CONCAT44(in_stack_ffffffffffffffc4,uVar7),severity,
                       (char *)in_stack_ffffffffffffffb0,
                       (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    poVar6 = GTestLog::GetStream(in_stack_ffffffffffffffb0);
    poVar6 = std::operator<<(poVar6,"Condition 0 <= begin && begin <= size failed. ");
    in_stack_ffffffffffffffa8 = std::operator<<(poVar6,"Invalid shuffle range start ");
    severity = (GTestLogSeverity)((ulong)poVar6 >> 0x20);
    poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffa8,local_c);
    poVar6 = std::operator<<(poVar6,": must be in range [0, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1c);
    std::operator<<(poVar6,"].");
    GTestLog::~GTestLog(in_stack_ffffffffffffff40);
  }
  local_71 = local_c <= local_10 && local_10 <= local_1c;
  bVar2 = IsTrue(local_71);
  if (!bVar2) {
    GTestLog::GTestLog((GTestLog *)CONCAT44(in_stack_ffffffffffffffc4,uVar7),severity,
                       (char *)in_stack_ffffffffffffffb0,
                       (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    poVar6 = GTestLog::GetStream(local_30);
    poVar6 = std::operator<<(poVar6,"Condition begin <= end && end <= size failed. ");
    poVar6 = std::operator<<(poVar6,"Invalid shuffle range finish ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6,": must be in range [");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_c);
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1c);
    std::operator<<(poVar6,"].");
    GTestLog::~GTestLog(in_stack_ffffffffffffff40);
  }
  for (local_34 = local_10 - local_c; iVar1 = local_c, 1 < local_34; local_34 = local_34 + -1) {
    iVar3 = local_c + local_34;
    UVar4 = Random::Generate((Random *)in_stack_ffffffffffffffb0,
                             (UInt32)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    __a = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)(int)(iVar1 + UVar4));
    __b = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)(iVar3 + -1));
    std::swap<int>(__a,__b);
  }
  return;
}

Assistant:

void ShuffleRange(internal::Random* random, int begin, int end,
                  std::vector<E>* v) {
  const int size = static_cast<int>(v->size());
  GTEST_CHECK_(0 <= begin && begin <= size)
      << "Invalid shuffle range start " << begin << ": must be in range [0, "
      << size << "].";
  GTEST_CHECK_(begin <= end && end <= size)
      << "Invalid shuffle range finish " << end << ": must be in range ["
      << begin << ", " << size << "].";

  // Fisher-Yates shuffle, from
  // http://en.wikipedia.org/wiki/Fisher-Yates_shuffle
  for (int range_width = end - begin; range_width >= 2; range_width--) {
    const int last_in_range = begin + range_width - 1;
    const int selected = begin + random->Generate(range_width);
    std::swap((*v)[selected], (*v)[last_in_range]);
  }
}